

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false>::
visit<slang::ast::WaitForkStatement>
          (ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false> *this,
          WaitForkStatement *t)

{
  bool bVar1;
  Statement *in_RSI;
  ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false> *in_RDI;
  
  bVar1 = Statement::bad(in_RSI);
  if (!bVar1) {
    visitDefault<slang::ast::WaitForkStatement>(in_RDI,(WaitForkStatement *)in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }